

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_atomics.cpp
# Opt level: O0

spv_result_t spvtools::val::AtomicsPass(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  DiagnosticStream *pDVar4;
  Instruction *pIVar5;
  spv_const_context psVar6;
  ulong uVar7;
  char *local_3360;
  DiagnosticStream local_3358;
  uint32_t local_317c;
  char *pcStack_3178;
  uint32_t comparator_type;
  DiagnosticStream local_3170;
  uint32_t local_2f94;
  char *pcStack_2f90;
  uint32_t value_type_1;
  DiagnosticStream local_2f88;
  uint32_t local_2dac;
  undefined1 local_2da8 [4];
  uint32_t value_type;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_2bd0;
  tuple<bool,_bool,_unsigned_int> local_2bb8;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_2bb0;
  tuple<bool,_bool,_unsigned_int> local_2b94;
  uint local_2b8c;
  uint local_2b88;
  uint32_t unequal_value;
  uint32_t equal_value;
  bool is_unequal_const;
  bool is_equal_const;
  uint uStack_2b7c;
  bool is_int32;
  spv_result_t error_2;
  uint32_t unequal_semantics_index;
  spv_result_t error_1;
  uint32_t equal_semantics_index;
  spv_result_t error;
  uint memory_scope;
  DiagnosticStream local_2b60;
  char *local_2988;
  DiagnosticStream local_2980;
  char *local_27a8;
  DiagnosticStream local_27a0;
  DiagnosticStream local_25c8;
  char *local_23f0;
  DiagnosticStream local_23e8;
  char *local_2210;
  DiagnosticStream local_2208;
  char *local_2030;
  DiagnosticStream local_2028;
  char *local_1e50;
  DiagnosticStream local_1e48;
  char *local_1c70;
  DiagnosticStream local_1c68;
  char *local_1a90;
  DiagnosticStream local_1a88;
  char *local_18b0;
  DiagnosticStream local_18a8;
  char *local_16d0;
  DiagnosticStream local_16c8;
  char *local_14f0;
  DiagnosticStream local_14e8;
  char *local_1310;
  DiagnosticStream local_1308;
  char *local_1130;
  string local_1128;
  DiagnosticStream local_1108;
  char *local_f30;
  DiagnosticStream local_f28;
  char *local_d50;
  DiagnosticStream local_d48;
  DiagnosticStream local_b70;
  char *local_998;
  DiagnosticStream local_990;
  StorageClass local_7b8;
  uint32_t local_7b4;
  StorageClass storage_class;
  uint32_t data_type;
  uint32_t pointer_type;
  uint32_t operand_index;
  DiagnosticStream local_7a0;
  char *local_5c8;
  DiagnosticStream local_5c0;
  char *local_3e8;
  DiagnosticStream local_3e0;
  char *local_208;
  DiagnosticStream local_200;
  uint32_t local_28;
  Op local_24;
  uint32_t result_type;
  Op opcode;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  _result_type = inst;
  inst_local = (Instruction *)_;
  local_24 = Instruction::opcode(inst);
  if ((((0xf < local_24 - OpAtomicLoad) && (1 < local_24 - OpAtomicFlagTestAndSet)) &&
      (1 < local_24 - OpAtomicFMinEXT)) && (local_24 != OpAtomicFAddEXT)) {
    return SPV_SUCCESS;
  }
  local_28 = Instruction::type_id(_result_type);
  bVar1 = anon_unknown.dwarf_165d7b6::HasReturnType(local_24);
  if (bVar1) {
    bVar1 = anon_unknown.dwarf_165d7b6::HasOnlyFloatReturnType(local_24);
    if (((bVar1) &&
        ((bVar1 = ValidationState_t::HasCapability
                            ((ValidationState_t *)inst_local,AtomicFloat16VectorNV), !bVar1 ||
         (bVar1 = ValidationState_t::IsFloat16Vector2Or4Type
                            ((ValidationState_t *)inst_local,local_28), !bVar1)))) &&
       (bVar1 = ValidationState_t::IsFloatScalarType((ValidationState_t *)inst_local,local_28),
       !bVar1)) {
      ValidationState_t::diag
                (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      local_208 = spvOpcodeString(local_24);
      pDVar4 = DiagnosticStream::operator<<(&local_200,&local_208);
      pDVar4 = DiagnosticStream::operator<<
                         (pDVar4,(char (*) [47])": expected Result Type to be float scalar type");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_200);
      return __local._4_4_;
    }
    bVar1 = anon_unknown.dwarf_165d7b6::HasOnlyIntReturnType(local_24);
    if ((bVar1) &&
       (bVar1 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_28), !bVar1
       )) {
      ValidationState_t::diag
                (&local_3e0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      local_3e8 = spvOpcodeString(local_24);
      pDVar4 = DiagnosticStream::operator<<(&local_3e0,&local_3e8);
      pDVar4 = DiagnosticStream::operator<<
                         (pDVar4,(char (*) [49])": expected Result Type to be integer scalar type");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_3e0);
      return __local._4_4_;
    }
    bVar1 = anon_unknown.dwarf_165d7b6::HasIntOrFloatReturnType(local_24);
    if ((((bVar1) &&
         (bVar1 = ValidationState_t::IsFloatScalarType((ValidationState_t *)inst_local,local_28),
         !bVar1)) &&
        ((local_24 != OpAtomicExchange ||
         ((bVar1 = ValidationState_t::HasCapability
                             ((ValidationState_t *)inst_local,AtomicFloat16VectorNV), !bVar1 ||
          (bVar1 = ValidationState_t::IsFloat16Vector2Or4Type
                             ((ValidationState_t *)inst_local,local_28), !bVar1)))))) &&
       (bVar1 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_28), !bVar1
       )) {
      ValidationState_t::diag
                (&local_5c0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      local_5c8 = spvOpcodeString(local_24);
      pDVar4 = DiagnosticStream::operator<<(&local_5c0,&local_5c8);
      pDVar4 = DiagnosticStream::operator<<
                         (pDVar4,(char (*) [58])
                                 ": expected Result Type to be integer or float scalar type");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_5c0);
      return __local._4_4_;
    }
    bVar1 = anon_unknown.dwarf_165d7b6::HasOnlyBoolReturnType(local_24);
    if ((bVar1) &&
       (bVar1 = ValidationState_t::IsBoolScalarType((ValidationState_t *)inst_local,local_28),
       !bVar1)) {
      ValidationState_t::diag
                (&local_7a0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      _pointer_type = spvOpcodeString(local_24);
      pDVar4 = DiagnosticStream::operator<<(&local_7a0,(char **)&pointer_type);
      pDVar4 = DiagnosticStream::operator<<
                         (pDVar4,(char (*) [46])": expected Result Type to be bool scalar type");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_7a0);
      return __local._4_4_;
    }
  }
  bVar1 = anon_unknown.dwarf_165d7b6::HasReturnType(local_24);
  uVar3 = 0;
  if (bVar1) {
    uVar3 = 2;
  }
  data_type = uVar3 + 1;
  storage_class =
       ValidationState_t::GetOperandTypeId
                 ((ValidationState_t *)inst_local,_result_type,(ulong)uVar3);
  local_7b4 = 0;
  bVar1 = ValidationState_t::GetPointerTypeInfo
                    ((ValidationState_t *)inst_local,storage_class,&local_7b4,&local_7b8);
  pIVar5 = inst_local;
  if (!bVar1) {
    ValidationState_t::diag
              (&local_990,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
    local_998 = spvOpcodeString(local_24);
    pDVar4 = DiagnosticStream::operator<<(&local_990,&local_998);
    pDVar4 = DiagnosticStream::operator<<
                       (pDVar4,(char (*) [40])": expected Pointer to be a pointer type");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    DiagnosticStream::~DiagnosticStream(&local_990);
    return __local._4_4_;
  }
  if (local_7b4 == 0) {
    if (local_24 != OpAtomicLoad) {
      if (local_24 == OpAtomicStore) {
        uVar3 = Instruction::GetOperandAs<unsigned_int>(_result_type,3);
        pIVar5 = ValidationState_t::FindDef((ValidationState_t *)pIVar5,uVar3);
        local_7b4 = Instruction::type_id(pIVar5);
        goto LAB_004e5483;
      }
      if (0xd < local_24 - OpAtomicExchange) {
        if (local_24 - OpAtomicFlagTestAndSet < 2) {
          ValidationState_t::diag
                    (&local_b70,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_result_type);
          pDVar4 = DiagnosticStream::operator<<
                             (&local_b70,
                              (char (*) [63])
                              "Untyped pointers are not supported by atomic flag instructions");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
          DiagnosticStream::~DiagnosticStream(&local_b70);
          return __local._4_4_;
        }
        if ((1 < local_24 - OpAtomicFMinEXT) && (local_24 != OpAtomicFAddEXT)) goto LAB_004e5483;
      }
    }
    local_7b4 = Instruction::type_id(_result_type);
  }
LAB_004e5483:
  bVar1 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_7b4);
  if (((bVar1) &&
      (uVar2 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_7b4),
      uVar2 == 0x40)) &&
     (bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,Int64Atomics), !bVar1
     )) {
    ValidationState_t::diag
              (&local_d48,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
    local_d50 = spvOpcodeString(local_24);
    pDVar4 = DiagnosticStream::operator<<(&local_d48,&local_d50);
    pDVar4 = DiagnosticStream::operator<<
                       (pDVar4,(char (*) [53])": 64-bit atomics require the Int64Atomics capability"
                       );
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    DiagnosticStream::~DiagnosticStream(&local_d48);
    return __local._4_4_;
  }
  bVar1 = anon_unknown.dwarf_165d7b6::IsStorageClassAllowedByUniversalRules(local_7b8);
  if (!bVar1) {
    ValidationState_t::diag
              (&local_f28,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
    local_f30 = spvOpcodeString(local_24);
    pDVar4 = DiagnosticStream::operator<<(&local_f28,&local_f30);
    pDVar4 = DiagnosticStream::operator<<
                       (pDVar4,(char (*) [57])
                               ": storage class forbidden by universal validation rules.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    DiagnosticStream::~DiagnosticStream(&local_f28);
    return __local._4_4_;
  }
  bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,Shader);
  if (bVar1) {
    psVar6 = ValidationState_t::context((ValidationState_t *)inst_local);
    bVar1 = spvIsVulkanEnv(psVar6->target_env);
    if (bVar1) {
      if ((((local_7b8 != Uniform) && (local_7b8 != StorageBuffer)) &&
          ((local_7b8 != Workgroup && ((local_7b8 != Image && (local_7b8 != PhysicalStorageBuffer)))
           ))) && (local_7b8 != TaskPayloadWorkgroupEXT)) {
        ValidationState_t::diag
                  (&local_1108,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
        ValidationState_t::VkErrorID_abi_cxx11_
                  (&local_1128,(ValidationState_t *)inst_local,0x124e,(char *)0x0);
        pDVar4 = DiagnosticStream::operator<<(&local_1108,&local_1128);
        local_1130 = spvOpcodeString(local_24);
        pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_1130);
        pDVar4 = DiagnosticStream::operator<<
                           (pDVar4,(char (*) [152])
                                   ": Vulkan spec only allows storage classes for atomic to be: Uniform, Workgroup, Image, StorageBuffer, PhysicalStorageBuffer or TaskPayloadWorkgroupEXT."
                           );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        std::__cxx11::string::~string((string *)&local_1128);
        DiagnosticStream::~DiagnosticStream(&local_1108);
        return __local._4_4_;
      }
    }
    else if (local_7b8 == Function) {
      ValidationState_t::diag
                (&local_1308,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      local_1310 = spvOpcodeString(local_24);
      pDVar4 = DiagnosticStream::operator<<(&local_1308,&local_1310);
      pDVar4 = DiagnosticStream::operator<<
                         (pDVar4,(char (*) [75])
                                 ": Function storage class forbidden when the Shader capability is declared."
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_1308);
      return __local._4_4_;
    }
    if (local_24 == OpAtomicFAddEXT) {
      uVar2 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_28);
      if (uVar2 == 0x10) {
        bVar1 = ValidationState_t::IsFloat16Vector2Or4Type((ValidationState_t *)inst_local,local_28)
        ;
        if (bVar1) {
          bVar1 = ValidationState_t::HasCapability
                            ((ValidationState_t *)inst_local,AtomicFloat16VectorNV);
          if (!bVar1) {
            ValidationState_t::diag
                      (&local_14e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       _result_type);
            local_14f0 = spvOpcodeString(local_24);
            pDVar4 = DiagnosticStream::operator<<(&local_14e8,&local_14f0);
            pDVar4 = DiagnosticStream::operator<<
                               (pDVar4,(char (*) [68])
                                       ": float vector atomics require the AtomicFloat16VectorNV capability"
                               );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
            DiagnosticStream::~DiagnosticStream(&local_14e8);
            return __local._4_4_;
          }
        }
        else {
          bVar1 = ValidationState_t::HasCapability
                            ((ValidationState_t *)inst_local,AtomicFloat16AddEXT);
          if (!bVar1) {
            ValidationState_t::diag
                      (&local_16c8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       _result_type);
            local_16d0 = spvOpcodeString(local_24);
            pDVar4 = DiagnosticStream::operator<<(&local_16c8,&local_16d0);
            pDVar4 = DiagnosticStream::operator<<
                               (pDVar4,(char (*) [63])
                                       ": float add atomics require the AtomicFloat32AddEXT capability"
                               );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
            DiagnosticStream::~DiagnosticStream(&local_16c8);
            return __local._4_4_;
          }
        }
      }
      uVar2 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_28);
      if ((uVar2 == 0x20) &&
         (bVar1 = ValidationState_t::HasCapability
                            ((ValidationState_t *)inst_local,AtomicFloat32AddEXT), !bVar1)) {
        ValidationState_t::diag
                  (&local_18a8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
        local_18b0 = spvOpcodeString(local_24);
        pDVar4 = DiagnosticStream::operator<<(&local_18a8,&local_18b0);
        pDVar4 = DiagnosticStream::operator<<
                           (pDVar4,(char (*) [63])
                                   ": float add atomics require the AtomicFloat32AddEXT capability")
        ;
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream(&local_18a8);
        return __local._4_4_;
      }
      uVar2 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_28);
      if ((uVar2 == 0x40) &&
         (bVar1 = ValidationState_t::HasCapability
                            ((ValidationState_t *)inst_local,AtomicFloat64AddEXT), !bVar1)) {
        ValidationState_t::diag
                  (&local_1a88,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
        local_1a90 = spvOpcodeString(local_24);
        pDVar4 = DiagnosticStream::operator<<(&local_1a88,&local_1a90);
        pDVar4 = DiagnosticStream::operator<<
                           (pDVar4,(char (*) [63])
                                   ": float add atomics require the AtomicFloat64AddEXT capability")
        ;
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream(&local_1a88);
        return __local._4_4_;
      }
    }
    else if ((local_24 == OpAtomicFMinEXT) || (local_24 == OpAtomicFMaxEXT)) {
      uVar2 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_28);
      if (uVar2 == 0x10) {
        bVar1 = ValidationState_t::IsFloat16Vector2Or4Type((ValidationState_t *)inst_local,local_28)
        ;
        if (bVar1) {
          bVar1 = ValidationState_t::HasCapability
                            ((ValidationState_t *)inst_local,AtomicFloat16VectorNV);
          if (!bVar1) {
            ValidationState_t::diag
                      (&local_1c68,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       _result_type);
            local_1c70 = spvOpcodeString(local_24);
            pDVar4 = DiagnosticStream::operator<<(&local_1c68,&local_1c70);
            pDVar4 = DiagnosticStream::operator<<
                               (pDVar4,(char (*) [68])
                                       ": float vector atomics require the AtomicFloat16VectorNV capability"
                               );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
            DiagnosticStream::~DiagnosticStream(&local_1c68);
            return __local._4_4_;
          }
        }
        else {
          bVar1 = ValidationState_t::HasCapability
                            ((ValidationState_t *)inst_local,AtomicFloat16MinMaxEXT);
          if (!bVar1) {
            ValidationState_t::diag
                      (&local_1e48,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       _result_type);
            local_1e50 = spvOpcodeString(local_24);
            pDVar4 = DiagnosticStream::operator<<(&local_1e48,&local_1e50);
            pDVar4 = DiagnosticStream::operator<<
                               (pDVar4,(char (*) [70])
                                       ": float min/max atomics require the AtomicFloat16MinMaxEXT capability"
                               );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
            DiagnosticStream::~DiagnosticStream(&local_1e48);
            return __local._4_4_;
          }
        }
      }
      uVar2 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_28);
      if ((uVar2 == 0x20) &&
         (bVar1 = ValidationState_t::HasCapability
                            ((ValidationState_t *)inst_local,AtomicFloat32MinMaxEXT), !bVar1)) {
        ValidationState_t::diag
                  (&local_2028,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
        local_2030 = spvOpcodeString(local_24);
        pDVar4 = DiagnosticStream::operator<<(&local_2028,&local_2030);
        pDVar4 = DiagnosticStream::operator<<
                           (pDVar4,(char (*) [70])
                                   ": float min/max atomics require the AtomicFloat32MinMaxEXT capability"
                           );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream(&local_2028);
        return __local._4_4_;
      }
      uVar2 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_28);
      if ((uVar2 == 0x40) &&
         (bVar1 = ValidationState_t::HasCapability
                            ((ValidationState_t *)inst_local,AtomicFloat64MinMaxEXT), !bVar1)) {
        ValidationState_t::diag
                  (&local_2208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
        local_2210 = spvOpcodeString(local_24);
        pDVar4 = DiagnosticStream::operator<<(&local_2208,&local_2210);
        pDVar4 = DiagnosticStream::operator<<
                           (pDVar4,(char (*) [70])
                                   ": float min/max atomics require the AtomicFloat64MinMaxEXT capability"
                           );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream(&local_2208);
        return __local._4_4_;
      }
    }
  }
  psVar6 = ValidationState_t::context((ValidationState_t *)inst_local);
  bVar1 = spvIsOpenCLEnv(psVar6->target_env);
  if (bVar1) {
    if ((((local_7b8 != Function) && (local_7b8 != Workgroup)) && (local_7b8 != CrossWorkgroup)) &&
       (local_7b8 != Generic)) {
      ValidationState_t::diag
                (&local_23e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      local_23f0 = spvOpcodeString(local_24);
      pDVar4 = DiagnosticStream::operator<<(&local_23e8,&local_23f0);
      pDVar4 = DiagnosticStream::operator<<
                         (pDVar4,(char (*) [98])
                                 ": storage class must be Function, Workgroup, CrossWorkGroup or Generic in the OpenCL environment."
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_23e8);
      return __local._4_4_;
    }
    psVar6 = ValidationState_t::context((ValidationState_t *)inst_local);
    if ((psVar6->target_env == SPV_ENV_OPENCL_1_2) && (local_7b8 == Generic)) {
      ValidationState_t::diag
                (&local_25c8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      pDVar4 = DiagnosticStream::operator<<
                         (&local_25c8,
                          (char (*) [58])"Storage class cannot be Generic in OpenCL 1.2 environment"
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_25c8);
      return __local._4_4_;
    }
  }
  if ((local_24 == OpAtomicFlagTestAndSet) || (local_24 == OpAtomicFlagClear)) {
    bVar1 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_7b4);
    if ((!bVar1) ||
       (uVar2 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_7b4),
       uVar2 != 0x20)) {
      ValidationState_t::diag
                (&local_27a0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      local_27a8 = spvOpcodeString(local_24);
      pDVar4 = DiagnosticStream::operator<<(&local_27a0,&local_27a8);
      pDVar4 = DiagnosticStream::operator<<
                         (pDVar4,(char (*) [62])
                                 ": expected Pointer to point to a value of 32-bit integer type");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_27a0);
      return __local._4_4_;
    }
  }
  else if (local_24 == OpAtomicStore) {
    bVar1 = ValidationState_t::IsFloatScalarType((ValidationState_t *)inst_local,local_7b4);
    if ((!bVar1) &&
       (bVar1 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_7b4),
       !bVar1)) {
      ValidationState_t::diag
                (&local_2980,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      local_2988 = spvOpcodeString(local_24);
      pDVar4 = DiagnosticStream::operator<<(&local_2980,&local_2988);
      pDVar4 = DiagnosticStream::operator<<
                         (pDVar4,(char (*) [56])
                                 ": expected Pointer to be a pointer to integer or float ");
      pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [12])0x623764);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_2980);
      return __local._4_4_;
    }
  }
  else if (local_7b4 != local_28) {
    ValidationState_t::diag
              (&local_2b60,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
    _error = spvOpcodeString(local_24);
    pDVar4 = DiagnosticStream::operator<<(&local_2b60,(char **)&error);
    pDVar4 = DiagnosticStream::operator<<
                       (pDVar4,(char (*) [59])
                               ": expected Pointer to point to a value of type Result Type");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    DiagnosticStream::~DiagnosticStream(&local_2b60);
    return __local._4_4_;
  }
  uVar7 = (ulong)data_type;
  data_type = data_type + 1;
  equal_semantics_index = Instruction::GetOperandAs<unsigned_int_const>(_result_type,uVar7);
  error_1 = ValidateMemoryScope((ValidationState_t *)inst_local,_result_type,equal_semantics_index);
  uVar2 = data_type;
  if (error_1 != SPV_SUCCESS) {
    return error_1;
  }
  unequal_semantics_index = data_type;
  data_type = data_type + 1;
  error_2 = ValidateMemorySemantics
                      ((ValidationState_t *)inst_local,_result_type,uVar2,equal_semantics_index);
  uVar2 = data_type;
  if (error_2 == SPV_SUCCESS) {
    if ((local_24 == OpAtomicCompareExchange) || (local_24 == OpAtomicCompareExchangeWeak)) {
      uStack_2b7c = data_type;
      data_type = data_type + 1;
      equal_value = ValidateMemorySemantics
                              ((ValidationState_t *)inst_local,_result_type,uVar2,
                               equal_semantics_index);
      pIVar5 = inst_local;
      if (equal_value != SPV_SUCCESS) {
        return equal_value;
      }
      unequal_value._3_1_ = 0;
      unequal_value._2_1_ = 0;
      unequal_value._1_1_ = 0;
      local_2b88 = 0;
      local_2b8c = 0;
      uVar3 = Instruction::GetOperandAs<unsigned_int>(_result_type,(ulong)unequal_semantics_index);
      ValidationState_t::EvalInt32IfConst(&local_2b94,(ValidationState_t *)pIVar5,uVar3);
      std::tie<bool,bool,unsigned_int>
                (&local_2bb0,(bool *)((long)&unequal_value + 3),(bool *)((long)&unequal_value + 2),
                 &local_2b88);
      std::tuple<bool&,bool&,unsigned_int&>::operator=
                ((tuple<bool&,bool&,unsigned_int&> *)&local_2bb0,&local_2b94);
      pIVar5 = inst_local;
      uVar3 = Instruction::GetOperandAs<unsigned_int>(_result_type,(ulong)uStack_2b7c);
      ValidationState_t::EvalInt32IfConst(&local_2bb8,(ValidationState_t *)pIVar5,uVar3);
      std::tie<bool,bool,unsigned_int>
                (&local_2bd0,(bool *)((long)&unequal_value + 3),(bool *)((long)&unequal_value + 1),
                 &local_2b8c);
      std::tuple<bool&,bool&,unsigned_int&>::operator=
                ((tuple<bool&,bool&,unsigned_int&> *)&local_2bd0,&local_2bb8);
      if ((((unequal_value._2_1_ & 1) != 0) && ((unequal_value._1_1_ & 1) != 0)) &&
         ((local_2b88 & 0x8000) != (local_2b8c & 0x8000))) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_2da8,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_ID,_result_type);
        pDVar4 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)local_2da8,
                            (char (*) [72])
                            "Volatile mask setting must match for Equal and Unequal memory semantics"
                           );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_2da8);
        return __local._4_4_;
      }
    }
    if (local_24 == OpAtomicStore) {
      local_2dac = ValidationState_t::GetOperandTypeId
                             ((ValidationState_t *)inst_local,_result_type,3);
      if (local_2dac != local_7b4) {
        ValidationState_t::diag
                  (&local_2f88,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
        pcStack_2f90 = spvOpcodeString(local_24);
        pDVar4 = DiagnosticStream::operator<<(&local_2f88,&stack0xffffffffffffd070);
        pDVar4 = DiagnosticStream::operator<<
                           (pDVar4,(char (*) [72])
                                   ": expected Value type and the type pointed to by Pointer to be the same"
                           );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream(&local_2f88);
        return __local._4_4_;
      }
    }
    else if (((local_24 != OpAtomicLoad) && (local_24 != OpAtomicIIncrement)) &&
            ((local_24 != OpAtomicIDecrement &&
             ((local_24 != OpAtomicFlagTestAndSet && (local_24 != OpAtomicFlagClear)))))) {
      uVar7 = (ulong)data_type;
      data_type = data_type + 1;
      local_2f94 = ValidationState_t::GetOperandTypeId
                             ((ValidationState_t *)inst_local,_result_type,uVar7);
      if (local_2f94 != local_28) {
        ValidationState_t::diag
                  (&local_3170,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
        pcStack_3178 = spvOpcodeString(local_24);
        pDVar4 = DiagnosticStream::operator<<(&local_3170,&stack0xffffffffffffce88);
        pDVar4 = DiagnosticStream::operator<<
                           (pDVar4,(char (*) [43])": expected Value to be of type Result Type");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream(&local_3170);
        return __local._4_4_;
      }
    }
    if ((local_24 == OpAtomicCompareExchange) || (local_24 == OpAtomicCompareExchangeWeak)) {
      uVar7 = (ulong)data_type;
      data_type = data_type + 1;
      local_317c = ValidationState_t::GetOperandTypeId
                             ((ValidationState_t *)inst_local,_result_type,uVar7);
      if (local_317c != local_28) {
        ValidationState_t::diag
                  (&local_3358,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
        local_3360 = spvOpcodeString(local_24);
        pDVar4 = DiagnosticStream::operator<<(&local_3358,&local_3360);
        pDVar4 = DiagnosticStream::operator<<
                           (pDVar4,(char (*) [48])": expected Comparator to be of type Result Type")
        ;
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream(&local_3358);
        return __local._4_4_;
      }
    }
    return SPV_SUCCESS;
  }
  return error_2;
}

Assistant:

spv_result_t AtomicsPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  switch (opcode) {
    case spv::Op::OpAtomicLoad:
    case spv::Op::OpAtomicStore:
    case spv::Op::OpAtomicExchange:
    case spv::Op::OpAtomicFAddEXT:
    case spv::Op::OpAtomicCompareExchange:
    case spv::Op::OpAtomicCompareExchangeWeak:
    case spv::Op::OpAtomicIIncrement:
    case spv::Op::OpAtomicIDecrement:
    case spv::Op::OpAtomicIAdd:
    case spv::Op::OpAtomicISub:
    case spv::Op::OpAtomicSMin:
    case spv::Op::OpAtomicUMin:
    case spv::Op::OpAtomicFMinEXT:
    case spv::Op::OpAtomicSMax:
    case spv::Op::OpAtomicUMax:
    case spv::Op::OpAtomicFMaxEXT:
    case spv::Op::OpAtomicAnd:
    case spv::Op::OpAtomicOr:
    case spv::Op::OpAtomicXor:
    case spv::Op::OpAtomicFlagTestAndSet:
    case spv::Op::OpAtomicFlagClear: {
      const uint32_t result_type = inst->type_id();

      // Validate return type first so can just check if pointer type is same
      // (if applicable)
      if (HasReturnType(opcode)) {
        if (HasOnlyFloatReturnType(opcode) &&
            (!(_.HasCapability(spv::Capability::AtomicFloat16VectorNV) &&
               _.IsFloat16Vector2Or4Type(result_type)) &&
             !_.IsFloatScalarType(result_type))) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Result Type to be float scalar type";
        } else if (HasOnlyIntReturnType(opcode) &&
                   !_.IsIntScalarType(result_type)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Result Type to be integer scalar type";
        } else if (HasIntOrFloatReturnType(opcode) &&
                   !_.IsFloatScalarType(result_type) &&
                   !(opcode == spv::Op::OpAtomicExchange &&
                     _.HasCapability(spv::Capability::AtomicFloat16VectorNV) &&
                     _.IsFloat16Vector2Or4Type(result_type)) &&
                   !_.IsIntScalarType(result_type)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Result Type to be integer or float scalar type";
        } else if (HasOnlyBoolReturnType(opcode) &&
                   !_.IsBoolScalarType(result_type)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Result Type to be bool scalar type";
        }
      }

      uint32_t operand_index = HasReturnType(opcode) ? 2 : 0;
      const uint32_t pointer_type = _.GetOperandTypeId(inst, operand_index++);
      uint32_t data_type = 0;
      spv::StorageClass storage_class;
      if (!_.GetPointerTypeInfo(pointer_type, &data_type, &storage_class)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Pointer to be a pointer type";
      }

      // If the pointer is an untyped pointer, get the data type elsewhere.
      if (data_type == 0) {
        switch (opcode) {
          case spv::Op::OpAtomicLoad:
          case spv::Op::OpAtomicExchange:
          case spv::Op::OpAtomicFAddEXT:
          case spv::Op::OpAtomicCompareExchange:
          case spv::Op::OpAtomicCompareExchangeWeak:
          case spv::Op::OpAtomicIIncrement:
          case spv::Op::OpAtomicIDecrement:
          case spv::Op::OpAtomicIAdd:
          case spv::Op::OpAtomicISub:
          case spv::Op::OpAtomicSMin:
          case spv::Op::OpAtomicUMin:
          case spv::Op::OpAtomicFMinEXT:
          case spv::Op::OpAtomicSMax:
          case spv::Op::OpAtomicUMax:
          case spv::Op::OpAtomicFMaxEXT:
          case spv::Op::OpAtomicAnd:
          case spv::Op::OpAtomicOr:
          case spv::Op::OpAtomicXor:
            data_type = inst->type_id();
            break;
          case spv::Op::OpAtomicFlagTestAndSet:
          case spv::Op::OpAtomicFlagClear:
            return _.diag(SPV_ERROR_INVALID_ID, inst)
                   << "Untyped pointers are not supported by atomic flag "
                      "instructions";
            break;
          case spv::Op::OpAtomicStore:
            data_type = _.FindDef(inst->GetOperandAs<uint32_t>(3))->type_id();
            break;
          default:
            break;
        }
      }

      // Can't use result_type because OpAtomicStore doesn't have a result
      if (_.IsIntScalarType(data_type) && _.GetBitWidth(data_type) == 64 &&
          !_.HasCapability(spv::Capability::Int64Atomics)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": 64-bit atomics require the Int64Atomics capability";
      }

      // Validate storage class against universal rules
      if (!IsStorageClassAllowedByUniversalRules(storage_class)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": storage class forbidden by universal validation rules.";
      }

      // Then Shader rules
      if (_.HasCapability(spv::Capability::Shader)) {
        // Vulkan environment rule
        if (spvIsVulkanEnv(_.context()->target_env)) {
          if ((storage_class != spv::StorageClass::Uniform) &&
              (storage_class != spv::StorageClass::StorageBuffer) &&
              (storage_class != spv::StorageClass::Workgroup) &&
              (storage_class != spv::StorageClass::Image) &&
              (storage_class != spv::StorageClass::PhysicalStorageBuffer) &&
              (storage_class != spv::StorageClass::TaskPayloadWorkgroupEXT)) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << _.VkErrorID(4686) << spvOpcodeString(opcode)
                   << ": Vulkan spec only allows storage classes for atomic to "
                      "be: Uniform, Workgroup, Image, StorageBuffer, "
                      "PhysicalStorageBuffer or TaskPayloadWorkgroupEXT.";
          }
        } else if (storage_class == spv::StorageClass::Function) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": Function storage class forbidden when the Shader "
                    "capability is declared.";
        }

        if (opcode == spv::Op::OpAtomicFAddEXT) {
          // result type being float checked already
          if (_.GetBitWidth(result_type) == 16) {
            if (_.IsFloat16Vector2Or4Type(result_type)) {
              if (!_.HasCapability(spv::Capability::AtomicFloat16VectorNV))
                return _.diag(SPV_ERROR_INVALID_DATA, inst)
                       << spvOpcodeString(opcode)
                       << ": float vector atomics require the "
                          "AtomicFloat16VectorNV capability";
            } else {
              if (!_.HasCapability(spv::Capability::AtomicFloat16AddEXT)) {
                return _.diag(SPV_ERROR_INVALID_DATA, inst)
                       << spvOpcodeString(opcode)
                       << ": float add atomics require the AtomicFloat32AddEXT "
                          "capability";
              }
            }
          }
          if ((_.GetBitWidth(result_type) == 32) &&
              (!_.HasCapability(spv::Capability::AtomicFloat32AddEXT))) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << spvOpcodeString(opcode)
                   << ": float add atomics require the AtomicFloat32AddEXT "
                      "capability";
          }
          if ((_.GetBitWidth(result_type) == 64) &&
              (!_.HasCapability(spv::Capability::AtomicFloat64AddEXT))) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << spvOpcodeString(opcode)
                   << ": float add atomics require the AtomicFloat64AddEXT "
                      "capability";
          }
        } else if (opcode == spv::Op::OpAtomicFMinEXT ||
                   opcode == spv::Op::OpAtomicFMaxEXT) {
          if (_.GetBitWidth(result_type) == 16) {
            if (_.IsFloat16Vector2Or4Type(result_type)) {
              if (!_.HasCapability(spv::Capability::AtomicFloat16VectorNV))
                return _.diag(SPV_ERROR_INVALID_DATA, inst)
                       << spvOpcodeString(opcode)
                       << ": float vector atomics require the "
                          "AtomicFloat16VectorNV capability";
            } else {
              if (!_.HasCapability(spv::Capability::AtomicFloat16MinMaxEXT)) {
                return _.diag(SPV_ERROR_INVALID_DATA, inst)
                       << spvOpcodeString(opcode)
                       << ": float min/max atomics require the "
                          "AtomicFloat16MinMaxEXT capability";
              }
            }
          }
          if ((_.GetBitWidth(result_type) == 32) &&
              (!_.HasCapability(spv::Capability::AtomicFloat32MinMaxEXT))) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << spvOpcodeString(opcode)
                   << ": float min/max atomics require the "
                      "AtomicFloat32MinMaxEXT capability";
          }
          if ((_.GetBitWidth(result_type) == 64) &&
              (!_.HasCapability(spv::Capability::AtomicFloat64MinMaxEXT))) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << spvOpcodeString(opcode)
                   << ": float min/max atomics require the "
                      "AtomicFloat64MinMaxEXT capability";
          }
        }
      }

      // And finally OpenCL environment rules
      if (spvIsOpenCLEnv(_.context()->target_env)) {
        if ((storage_class != spv::StorageClass::Function) &&
            (storage_class != spv::StorageClass::Workgroup) &&
            (storage_class != spv::StorageClass::CrossWorkgroup) &&
            (storage_class != spv::StorageClass::Generic)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": storage class must be Function, Workgroup, "
                    "CrossWorkGroup or Generic in the OpenCL environment.";
        }

        if (_.context()->target_env == SPV_ENV_OPENCL_1_2) {
          if (storage_class == spv::StorageClass::Generic) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << "Storage class cannot be Generic in OpenCL 1.2 "
                      "environment";
          }
        }
      }

      // If result and pointer type are different, need to do special check here
      if (opcode == spv::Op::OpAtomicFlagTestAndSet ||
          opcode == spv::Op::OpAtomicFlagClear) {
        if (!_.IsIntScalarType(data_type) || _.GetBitWidth(data_type) != 32) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Pointer to point to a value of 32-bit integer "
                    "type";
        }
      } else if (opcode == spv::Op::OpAtomicStore) {
        if (!_.IsFloatScalarType(data_type) && !_.IsIntScalarType(data_type)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Pointer to be a pointer to integer or float "
                 << "scalar type";
        }
      } else if (data_type != result_type) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Pointer to point to a value of type Result "
                  "Type";
      }

      auto memory_scope = inst->GetOperandAs<const uint32_t>(operand_index++);
      if (auto error = ValidateMemoryScope(_, inst, memory_scope)) {
        return error;
      }

      const auto equal_semantics_index = operand_index++;
      if (auto error = ValidateMemorySemantics(_, inst, equal_semantics_index,
                                               memory_scope))
        return error;

      if (opcode == spv::Op::OpAtomicCompareExchange ||
          opcode == spv::Op::OpAtomicCompareExchangeWeak) {
        const auto unequal_semantics_index = operand_index++;
        if (auto error = ValidateMemorySemantics(
                _, inst, unequal_semantics_index, memory_scope))
          return error;

        // Volatile bits must match for equal and unequal semantics. Previous
        // checks guarantee they are 32-bit constants, but we need to recheck
        // whether they are evaluatable constants.
        bool is_int32 = false;
        bool is_equal_const = false;
        bool is_unequal_const = false;
        uint32_t equal_value = 0;
        uint32_t unequal_value = 0;
        std::tie(is_int32, is_equal_const, equal_value) = _.EvalInt32IfConst(
            inst->GetOperandAs<uint32_t>(equal_semantics_index));
        std::tie(is_int32, is_unequal_const, unequal_value) =
            _.EvalInt32IfConst(
                inst->GetOperandAs<uint32_t>(unequal_semantics_index));
        if (is_equal_const && is_unequal_const &&
            ((equal_value & uint32_t(spv::MemorySemanticsMask::Volatile)) ^
             (unequal_value & uint32_t(spv::MemorySemanticsMask::Volatile)))) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "Volatile mask setting must match for Equal and Unequal "
                    "memory semantics";
        }
      }

      if (opcode == spv::Op::OpAtomicStore) {
        const uint32_t value_type = _.GetOperandTypeId(inst, 3);
        if (value_type != data_type) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Value type and the type pointed to by "
                    "Pointer to be the same";
        }
      } else if (opcode != spv::Op::OpAtomicLoad &&
                 opcode != spv::Op::OpAtomicIIncrement &&
                 opcode != spv::Op::OpAtomicIDecrement &&
                 opcode != spv::Op::OpAtomicFlagTestAndSet &&
                 opcode != spv::Op::OpAtomicFlagClear) {
        const uint32_t value_type = _.GetOperandTypeId(inst, operand_index++);
        if (value_type != result_type) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Value to be of type Result Type";
        }
      }

      if (opcode == spv::Op::OpAtomicCompareExchange ||
          opcode == spv::Op::OpAtomicCompareExchangeWeak) {
        const uint32_t comparator_type =
            _.GetOperandTypeId(inst, operand_index++);
        if (comparator_type != result_type) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Comparator to be of type Result Type";
        }
      }

      break;
    }

    default:
      break;
  }

  return SPV_SUCCESS;
}